

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_3> __thiscall tcu::normalize<float,3>(tcu *this,Vector<float,_3> *a)

{
  Type_conflict TVar1;
  float fVar2;
  float fVar3;
  ulong extraout_XMM0_Qa;
  Vector<float,_3> VVar5;
  int local_20;
  int i;
  float ooLen;
  Vector<float,_3> *a_local;
  Vector<float,_3> *res;
  ulong uVar4;
  
  TVar1 = length<float,3>(a);
  fVar2 = 1.0 / TVar1;
  Vector<float,_3>::Vector((Vector<float,_3> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    fVar3 = fVar2 * a->m_data[local_20];
    uVar4 = (ulong)(uint)fVar3;
    *(float *)(this + (long)local_20 * 4) = fVar3;
  }
  VVar5.m_data[2] = TVar1;
  VVar5.m_data[0] = (float)(int)uVar4;
  VVar5.m_data[1] = (float)(int)(uVar4 >> 0x20);
  return (Vector<float,_3>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}